

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_map.cpp
# Opt level: O2

void anon_unknown.dwarf_5a7e8::SequenceTester<QList<int>_>::exec(void)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QString>_>_> QVar2;
  QString *pQVar3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<int>_>_> QVar4;
  bool bVar5;
  PromiseData<QList<QString>_> *pPVar6;
  PromiseData<QList<QByteArray>_> *this;
  long lVar7;
  QPromiseReject<QList<QByteArray>_> *in_R8;
  initializer_list<int> args;
  initializer_list<QString> args_00;
  PromiseResolver<QList<QString>_> resolver_3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>
  local_238;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>
  local_230;
  QArrayDataPointer<QString> local_228;
  QPromiseBase<QList<QString>_> local_210;
  QPromiseBase<QList<QString>_> local_200;
  PromiseResolver<QList<QString>_> resolver;
  QArrayDataPointer<QString> local_1d0;
  function<void_(const_QList<QByteArray>_&)> local_1b8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data> local_190;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data> local_188;
  undefined1 local_180 [24];
  QString local_168;
  QString local_150;
  PromiseType p;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  QPromiseBase<QList<int>_> local_108;
  _Any_data local_f8 [2];
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  QArrayDataPointer<QString> local_b0;
  _Any_data local_98 [2];
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_58;
  int local_34 [3];
  
  local_34[0] = 0x2a;
  local_34[1] = 0x2b;
  local_34[2] = 0x2c;
  args._M_len = 3;
  args._M_array = local_34;
  QList<int>::QList((QList<int> *)&local_b0,args);
  QtPromise::resolve<QList<int>>((QtPromise *)&local_108,(QList<int> *)&local_b0);
  local_210._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014b060;
  pPVar6 = (PromiseData<QList<QString>_> *)operator_new(0x68);
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<QString>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_catchers.d.size =
       0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_handlers.d.size =
       0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)
   &(pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_lock = 0;
  *(undefined8 *)
   &(pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_settled = 0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).super_QSharedData
       = 0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<QString>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<QList<QString>_>::PromiseData(pPVar6);
  LOCK();
  pQVar1 = &(pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
            super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<QList<QString>_> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1b8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0014b470;
  local_210.m_d.d = pPVar6;
  local_1b8.super__Function_base._M_functor._8_8_ = pPVar6;
  QtPromisePrivate::PromiseResolver<QList<QString>_>::PromiseResolver
            (&resolver,(QPromise<QList<QString>_> *)&local_1b8);
  QtPromise::QPromiseBase<QList<QString>_>::~QPromiseBase
            ((QPromiseBase<QList<QString>_> *)&local_1b8);
  QVar4.d = local_108.m_d.d;
  if (resolver.m_d.d == (Data *)0x0) {
    local_180._0_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_180._0_8_ = resolver;
  }
  local_f8[0]._M_unused._M_object = (void *)0x0;
  if ((Data *)local_180._0_8_ == (Data *)0x0) {
    local_180._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_180._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_180._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_180._8_8_ = local_180._0_8_;
  }
  local_98[0]._M_unused._M_object = (void *)0x0;
  if ((Data *)local_180._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_180._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_180._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_180._8_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_180._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_180._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_128._M_unused._0_8_ = local_180._0_8_;
  local_d8._M_unused._0_8_ = local_180._8_8_;
  local_78._M_unused._M_object = operator_new(0x18);
  *(undefined8 *)local_78._M_unused._0_8_ = local_180._0_8_;
  if ((Data *)local_180._0_8_ != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_180._0_8_)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_180._0_8_)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_180._8_8_;
  if ((Data *)local_180._8_8_ != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_180._8_8_)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_180._8_8_)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(code *)((long)local_78._M_unused._0_8_ + 0x10) = local_180[0x10];
  pcStack_60 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<QList<int>,QtPromise::QPromise<QList<int>>::map<(anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<int>const&)#1}(int,...)#1}>((anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<int>const&)#1}(int,...)#1})::{lambda(QList<int>const&)#1}(QList<int>const&)#1},QList<int>const&>
  ::
  create<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>(QtPromise::QPromise<QList<int>>::map<(anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<int>const&)#1}(int,...)#1}>((anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<int>const&)#1}(int,...)#1})::{lambda(QList<int>const&)#1}(QList<int>const&)#1}const&,QtPromise::QPromiseResolve<QList<QString>>const&,QtPromise::QPromiseReject<QList<QString>>const&)
  ::{lambda(QList<int>const&)#1}::~function((_lambda_QList<int>const___1_ *)local_180);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            (&(QVar4.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,
             (function<void_(const_QList<int>_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  QVar4.d = local_108.m_d.d;
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>
            (&local_58,(PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&local_128,
             (QPromiseResolve<QList<QString>_> *)&local_d8,(QPromiseReject<QList<QString>_> *)in_R8)
  ;
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            (&(QVar4.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>,&local_58);
  std::_Function_base::~_Function_base(&local_58.super__Function_base);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>
              *)&local_d8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>
              *)local_98);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>
              *)&local_128);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>
              *)local_f8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_210._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014b470;
  bVar5 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    (&(local_108.m_d.d)->
                      super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
              (&(local_108.m_d.d)->super_PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>);
  }
  local_200._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014b060;
  pPVar6 = (PromiseData<QList<QString>_> *)operator_new(0x68);
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<QString>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_catchers.d.size =
       0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_handlers.d.size =
       0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)
   &(pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_lock = 0;
  *(undefined8 *)
   &(pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_settled = 0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).super_QSharedData
       = 0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<QString>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<QList<QString>_>::PromiseData(pPVar6);
  LOCK();
  pQVar1 = &(pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
            super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<QList<QString>_> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1b8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0014b470;
  local_200.m_d.d = pPVar6;
  local_1b8.super__Function_base._M_functor._8_8_ = pPVar6;
  QtPromisePrivate::PromiseResolver<QList<QString>_>::PromiseResolver
            (&resolver,(QPromise<QList<QString>_> *)&local_1b8);
  QtPromise::QPromiseBase<QList<QString>_>::~QPromiseBase
            ((QPromiseBase<QList<QString>_> *)&local_1b8);
  QVar2.d = local_210.m_d.d;
  if (resolver.m_d.d == (Data *)0x0) {
    local_180._0_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_180._0_8_ = resolver;
  }
  local_f8[0]._M_unused._M_object = (void *)0x0;
  if ((Data *)local_180._0_8_ == (Data *)0x0) {
    local_228.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_180._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_180._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_228.d = (Data *)local_180._0_8_;
  }
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>)
       (Data *)0x0;
  if ((Data *)local_180._0_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_180._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_180._0_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_228.d != (Data *)0x0) {
    LOCK();
    (((Data *)local_228.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_228.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_180._8_8_ = local_228.d;
  local_128._M_unused._0_8_ = local_180._0_8_;
  local_d8._M_unused._M_object = operator_new(0x18);
  *(undefined8 *)local_d8._M_unused._0_8_ = local_180._0_8_;
  if ((Data *)local_180._0_8_ != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_180._0_8_)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_180._0_8_)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = local_180._8_8_;
  if ((Data *)local_180._8_8_ != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_180._8_8_)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_180._8_8_)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(code *)((long)local_d8._M_unused._0_8_ + 0x10) = local_180[0x10];
  pcStack_c0 = std::
               _Function_handler<void_(const_QList<QString>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(const_QList<QString>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<QList<QString>,QtPromise::QPromise<QList<QString>>::map<(anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<QString>const&)#1}(QString_const&,int)#1}>((anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<QString>const&)#1}(QString_const&,int)#1})::{lambda(QList<QString>const&)#1}(QList<QString>const&)#1},QList<QString>const&>
  ::
  create<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>(QtPromise::QPromise<QList<QString>>::map<(anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<QString>const&)#1}(QString_const&,int)#1}>((anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<QString>const&)#1}(QString_const&,int)#1})::{lambda(QList<QString>const&)#1}(QList<QString>const&)#1}const&,QtPromise::QPromiseResolve<QList<QString>>const&,QtPromise::QPromiseReject<QList<QString>>const&)
  ::{lambda(QList<QString>const&)#1}::~function((_lambda_QList<QString>const___1_ *)local_180);
  QtPromisePrivate::PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>,
             (function<void_(const_QList<QString>_&)> *)&local_d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  QVar2.d = local_210.m_d.d;
  QtPromisePrivate::PromiseCatcher<QList<QString>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_98,
             (PromiseCatcher<QList<QString>,decltype(nullptr),void> *)0x0,&local_128,
             (QPromiseResolve<QList<QString>_> *)&local_228,(QPromiseReject<QList<QString>_> *)in_R8
            );
  QtPromisePrivate::PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_98);
  std::_Function_base::~_Function_base((_Function_base *)local_98);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>
              *)&local_228);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_3.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>
              *)&local_128);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>
              *)local_f8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_200._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0014b470;
  bVar5 = QtPromisePrivate::PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::
          isPending(&(local_210.m_d.d)->
                     super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::dispatch
              (&(local_210.m_d.d)->
                super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>);
  }
  local_1d0.d = (Data *)&PTR__QPromiseBase_0014b828;
  this = (PromiseData<QList<QByteArray>_> *)operator_new(0x68);
  (this->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (this->m_value).m_data.super___shared_ptr<QList<QByteArray>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).m_catchers.d.
  ptr = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
        0x0;
  (this->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).m_catchers.d.
  size = 0;
  (this->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).m_handlers.d.
  size = 0;
  (this->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).m_catchers.d.d
       = (Data *)0x0;
  (this->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).m_handlers.d.d
       = (Data *)0x0;
  (this->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).m_handlers.d.
  ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)
   &(this->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).m_lock = 0;
  *(undefined8 *)
   &(this->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).m_settled = 0
  ;
  (this->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &(this->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).
    super_QSharedData = 0;
  (this->m_value).m_data.super___shared_ptr<QList<QByteArray>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<QList<QByteArray>_>::PromiseData(this);
  LOCK();
  pQVar1 = &(this->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).
            super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this != (PromiseData<QList<QByteArray>_> *)0x0) {
    LOCK();
    pQVar1 = &(this->super_PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1b8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_0014b7e0;
  local_1d0.ptr = (QString *)this;
  local_1b8.super__Function_base._M_functor._8_8_ = this;
  QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::PromiseResolver
            ((PromiseResolver<QList<QByteArray>_> *)&resolver,
             (QPromise<QList<QByteArray>_> *)&local_1b8);
  QtPromise::QPromiseBase<QList<QByteArray>_>::~QPromiseBase
            ((QPromiseBase<QList<QByteArray>_> *)&local_1b8);
  QVar2.d = local_200.m_d.d;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>)
         (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_3.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>)
       (Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_230.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_230.d = (Data *)resolver.m_d.d;
  }
  local_238.d = (Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_230.d != (Data *)0x0) {
    LOCK();
    ((local_230.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_230.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_118 = (code *)0x0;
  pcStack_110 = (code *)0x0;
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_228.d = (Data *)resolver.m_d.d;
  local_180._0_8_ = resolver.m_d.d;
  local_180._8_8_ = local_230.d;
  local_128._M_unused._M_object = operator_new(0x18);
  *(undefined8 *)local_128._M_unused._0_8_ = local_180._0_8_;
  if ((Data *)local_180._0_8_ != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_180._0_8_)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_180._0_8_)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_128._M_unused._0_8_ + 8) = local_180._8_8_;
  if ((Data *)local_180._8_8_ != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_180._8_8_)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_180._8_8_)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(code *)((long)local_128._M_unused._0_8_ + 0x10) = local_180[0x10];
  pcStack_110 = std::
                _Function_handler<void_(const_QList<QString>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                ::_M_invoke;
  local_118 = std::
              _Function_handler<void_(const_QList<QString>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
              ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<QList<QString>,QtPromise::QPromise<QList<QString>>::map<(anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<QString>const&)#1}(QString_const&,...)#1}>((anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<QString>const&)#1}(QString_const&,...)#1})::{lambda(QList<QString>const&)#1}(QList<QString>const&)#1},QList<QString>const&>
  ::
  create<QtPromise::QPromiseResolve<QList<QByteArray>>,QtPromise::QPromiseReject<QList<QByteArray>>>(QtPromise::QPromise<QList<QString>>::map<(anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<QString>const&)#1}(QString_const&,...)#1}>((anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<QString>const&)#1}(QString_const&,...)#1})::{lambda(QList<QString>const&)#1}(QList<QString>const&)#1}const&,QtPromise::QPromiseResolve<QList<QByteArray>>const&,QtPromise::QPromiseReject<QList<QByteArray>>const&)
  ::{lambda(QList<QString>const&)#1}::~function((_lambda_QList<QString>const___1_ *)local_180);
  QtPromisePrivate::PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>,
             (function<void_(const_QList<QString>_&)> *)&local_128);
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  QVar2.d = local_200.m_d.d;
  QtPromisePrivate::PromiseCatcher<QList<QString>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<QByteArray>>,QtPromise::QPromiseReject<QList<QByteArray>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_f8,
             (PromiseCatcher<QList<QString>,decltype(nullptr),void> *)0x0,&local_228,
             (QPromiseResolve<QList<QByteArray>_> *)&local_230,in_R8);
  QtPromisePrivate::PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)local_f8);
  std::_Function_base::~_Function_base((_Function_base *)local_f8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_230);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_238);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>
              *)&local_228);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>
              *)&resolver_3);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QByteArray>_>::Data>
              *)&resolver);
  local_1d0.d = (Data *)&PTR__QPromiseBase_0014b7e0;
  bVar5 = QtPromisePrivate::PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::
          isPending(&(local_200.m_d.d)->
                     super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::dispatch
              (&(local_200.m_d.d)->
                super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>);
  }
  p.super_QPromiseBase<QList<QString>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_0014b060;
  pPVar6 = (PromiseData<QList<QString>_> *)operator_new(0x68);
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<QString>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_catchers.d.size =
       0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_handlers.d.size =
       0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)
   &(pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_lock = 0;
  *(undefined8 *)
   &(pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_settled = 0;
  (pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &(pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).super_QSharedData
       = 0;
  (pPVar6->m_value).m_data.super___shared_ptr<QList<QString>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<QList<QString>_>::PromiseData(pPVar6);
  LOCK();
  pQVar1 = &(pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
            super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (pPVar6 != (PromiseData<QList<QString>_> *)0x0) {
    LOCK();
    pQVar1 = &(pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_228.d = (Data *)&PTR__QPromiseBase_0014b470;
  local_228.ptr = (QString *)pPVar6;
  p.super_QPromiseBase<QList<QString>_>.m_d.d = pPVar6;
  QtPromisePrivate::PromiseResolver<QList<QString>_>::PromiseResolver
            (&resolver_3,(QPromise<QList<QString>_> *)&local_228);
  QtPromise::QPromiseBase<QList<QString>_>::~QPromiseBase
            ((QPromiseBase<QList<QString>_> *)&local_228);
  pQVar3 = local_1d0.ptr;
  if (resolver_3.m_d.d == (Data *)0x0) {
    local_230.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
    UNLOCK();
    local_230.d = (Data *)resolver_3;
  }
  local_238.d = (Data *)0x0;
  if (local_230.d == (Data *)0x0) {
    local_188.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)local_230.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_230.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_188.d = (Data *)local_230.d;
  }
  local_190.d = (Data *)0x0;
  if (local_230.d != (Data *)0x0) {
    LOCK();
    (((Data *)local_230.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_230.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_188.d != (Data *)0x0) {
    LOCK();
    ((local_188.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_188.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1b8.super__Function_base._M_manager = (_Manager_type)0x0;
  local_1b8._M_invoker = (_Invoker_type)0x0;
  local_1b8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_1b8.super__Function_base._M_functor._8_8_ = 0;
  local_180._0_8_ = local_230.d;
  local_180._8_8_ = local_188.d;
  local_1b8.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
  *(undefined8 *)local_1b8.super__Function_base._M_functor._M_unused._0_8_ = local_180._0_8_;
  if ((Data *)local_180._0_8_ != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_180._0_8_)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_180._0_8_)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_1b8.super__Function_base._M_functor._M_unused._0_8_ + 8) =
       local_180._8_8_;
  if ((Data *)local_180._8_8_ != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_180._8_8_)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
    ._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_180._8_8_)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(code *)((long)local_1b8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       local_180[0x10];
  local_1b8._M_invoker =
       std::
       _Function_handler<void_(const_QList<QByteArray>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
       ::_M_invoke;
  local_1b8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_QList<QByteArray>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
       ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<QList<QByteArray>,QtPromise::QPromise<QList<QByteArray>>::map<(anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<QByteArray>const&)#1}(QByteArray_const&,...)#1}>((anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<QByteArray>const&)#1}(QByteArray_const&,...)#1})::{lambda(QList<QByteArray>const&)#1}(QList<QByteArray>const&)#1},QList<QByteArray>const&>
  ::
  create<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>(QtPromise::QPromise<QList<QByteArray>>::map<(anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<QByteArray>const&)#1}(QByteArray_const&,...)#1}>((anonymous_namespace)::SequenceTester<QList<int>>::exec()::{lambda(QList<QByteArray>const&)#1}(QByteArray_const&,...)#1})::{lambda(QList<QByteArray>const&)#1}(QList<QByteArray>const&)#1}const&,QtPromise::QPromiseResolve<QList<QString>>const&,QtPromise::QPromiseReject<QList<QString>>const&)
  ::{lambda(QList<QByteArray>const&)#1}::~function((_lambda_QList<QByteArray>const___1_ *)local_180)
  ;
  QtPromisePrivate::PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>::addHandler
            ((PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)> *)pQVar3,
             &local_1b8);
  std::_Function_base::~_Function_base(&local_1b8.super__Function_base);
  pQVar3 = local_1d0.ptr;
  QtPromisePrivate::PromiseCatcher<QList<QByteArray>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver,
             (PromiseCatcher<QList<QByteArray>,decltype(nullptr),void> *)0x0,&local_230,
             (QPromiseResolve<QList<QString>_> *)&local_188,(QPromiseReject<QList<QString>_> *)in_R8
            );
  QtPromisePrivate::PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>::addCatcher
            ((PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)> *)pQVar3,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  std::_Function_base::~_Function_base((_Function_base *)&resolver);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_188);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_190);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>
              *)&local_230);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>
              *)&local_238);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_3.m_d);
  p.super_QPromiseBase<QList<QString>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_0014b470;
  bVar5 = QtPromisePrivate::PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>::
          isPending((PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)> *)
                    local_1d0.ptr);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)>::dispatch
              ((PromiseDataBase<QList<QByteArray>,_void_(const_QList<QByteArray>_&)> *)local_1d0.ptr
              );
  }
  QtPromise::QPromiseBase<QList<QByteArray>_>::~QPromiseBase
            ((QPromiseBase<QList<QByteArray>_> *)&local_1d0);
  QtPromise::QPromiseBase<QList<QString>_>::~QPromiseBase(&local_200);
  QtPromise::QPromiseBase<QList<QString>_>::~QPromiseBase(&local_210);
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase(&local_108);
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_b0);
  local_228.d = (Data *)0x0;
  local_228.ptr = (QString *)0x0;
  local_228.size = 0;
  waitForValue<QList<QString>>((QList<QString> *)&local_b0,&p,(QList<QString> *)&local_228);
  QString::QString((QString *)local_180,"0:43!");
  QString::QString(&local_168,"1:44!");
  QString::QString(&local_150,"2:45!");
  args_00._M_len = 3;
  args_00._M_array = (iterator)local_180;
  QList<QString>::QList((QList<QString> *)&local_1d0,args_00);
  QTest::qCompare<QString>
            ((QList<QString> *)&local_b0,(QList<QString> *)&local_1d0,
             "waitForValue(p, QVector<QString>{})",
             "(QVector<QString>{\"0:43!\", \"1:44!\", \"2:45!\"})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_map.cpp"
             ,0x37);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_1d0);
  lVar7 = 0x30;
  do {
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)(local_180 + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_b0);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_228);
  QtPromise::QPromiseBase<QList<QString>_>::~QPromiseBase(&p.super_QPromiseBase<QList<QString>_>);
  return;
}

Assistant:

static void exec()
    {
        auto p = QtPromise::resolve(Sequence{42, 43, 44})
                     .map([](int v, ...) {
                         return QString::number(v + 1);
                     })
                     .map([](const QString& v, int i) {
                         return QtPromise::resolve(QString{"%1:%2"}.arg(i).arg(v));
                     })
                     .map([](const QString& v, ...) {
                         return QtPromise::resolve((v + "!").toUtf8());
                     })
                     .map([](const QByteArray& v, ...) {
                         return QString::fromUtf8(v);
                     });

        Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<QString>>>::value));
        QCOMPARE(waitForValue(p, QVector<QString>{}),
                 (QVector<QString>{"0:43!", "1:44!", "2:45!"}));
    }